

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<tcu::Vector<float,_2>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_2>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  long lVar1;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  double dStack_20;
  
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x40);
  lVar1 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar1 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar1 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x28);
  if ((iargs->a->m_lo <= 1.0) && (1.0 <= iargs->a->m_hi)) {
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
              (__return_storage_ptr__,iargs->b);
    __return_storage_ptr__->m_data[1].m_lo = local_28;
    __return_storage_ptr__->m_data[1].m_hi = dStack_20;
    __return_storage_ptr__->m_data[0].m_hi = local_38;
    *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_30;
    *(undefined8 *)__return_storage_ptr__->m_data = local_48;
    __return_storage_ptr__->m_data[0].m_lo = dStack_40;
  }
  if ((iargs->a->m_lo <= 0.0) && (0.0 <= iargs->a->m_hi)) {
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
              (__return_storage_ptr__,iargs->c);
    __return_storage_ptr__->m_data[1].m_lo = local_28;
    __return_storage_ptr__->m_data[1].m_hi = dStack_20;
    __return_storage_ptr__->m_data[0].m_hi = local_38;
    *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_30;
    *(undefined8 *)__return_storage_ptr__->m_data = local_48;
    __return_storage_ptr__->m_data[0].m_lo = dStack_40;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}